

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.cpp
# Opt level: O0

Token * __thiscall GetOpt::GetOpt_pp::_add_token(GetOpt_pp *this,string *value,Type type)

{
  Token *this_00;
  Token *ret;
  Type type_local;
  string *value_local;
  GetOpt_pp *this_local;
  
  this_00 = (Token *)operator_new(0x30);
  Token::Token(this_00,value,type);
  if (this->_first_token == (Token *)0x0) {
    this->_first_token = this_00;
  }
  else {
    Token::link_to(this->_last_token,this_00);
  }
  this->_last_token = this_00;
  return this_00;
}

Assistant:

GETOPT_INLINE Token* GetOpt_pp::_add_token(const std::string& value, Token::Type type)
{
    Token* const ret = new Token(value, type);
    if (_first_token == NULL)
        _first_token = ret;
    else
        _last_token->link_to(ret);
    _last_token = ret;
    return ret;
}